

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O3

vector<indk::Neuron_*,_std::allocator<indk::Neuron_*>_> * __thiscall
indk::NeuralNet::getNeurons
          (vector<indk::Neuron_*,_std::allocator<indk::Neuron_*>_> *__return_storage_ptr__,
          NeuralNet *this)

{
  pointer *pppNVar1;
  iterator __position;
  _Rb_tree_node_base *p_Var2;
  
  (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var2 = (this->Neurons)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->Neurons)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<indk::Neuron*,std::allocator<indk::Neuron*>>::
      _M_realloc_insert<indk::Neuron*const&>
                ((vector<indk::Neuron*,std::allocator<indk::Neuron*>> *)__return_storage_ptr__,
                 __position,(Neuron **)(p_Var2 + 2));
    }
    else {
      *__position._M_current = *(Neuron **)(p_Var2 + 2);
      pppNVar1 = &(__return_storage_ptr__->
                  super__Vector_base<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<indk::Neuron*> indk::NeuralNet::getNeurons() {
    std::vector<indk::Neuron*> neurons;
    for (auto &n: Neurons) {
        neurons.push_back(n.second);
    }
    return neurons;
}